

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.cpp
# Opt level: O3

ProgramBinary * __thiscall
vk::anon_unknown_8::createProgramBinaryFromSpirV
          (anon_unknown_8 *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *binary)

{
  ProgramBinary *pPVar1;
  allocator_type local_19;
  
  pPVar1 = (ProgramBinary *)operator_new(0x20);
  pPVar1->m_format = PROGRAM_FORMAT_SPIRV;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&pPVar1->m_binary,(uchar *)this,
             (uchar *)binary,&local_19);
  return pPVar1;
}

Assistant:

ProgramBinary* createProgramBinaryFromSpirV (const vector<deUint32>& binary)
{
	DE_ASSERT(!binary.empty());

	if (isNativeSpirVBinaryEndianness())
		return new ProgramBinary(PROGRAM_FORMAT_SPIRV, binary.size()*sizeof(deUint32), (const deUint8*)&binary[0]);
	else
		TCU_THROW(InternalError, "SPIR-V endianness translation not supported");
}